

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O2

void __thiscall QLineEdit::mouseReleaseEvent(QLineEdit *this,QMouseEvent *e)

{
  QLineEditPrivate *this_00;
  bool bVar1;
  char cVar2;
  EVP_PKEY_CTX *src;
  long in_FS_OFFSET;
  QPointF local_48;
  QPoint local_38;
  QRect local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  bVar1 = QLineEditPrivate::sendMouseEventToInputContext(this_00,e);
  if (!bVar1) {
    if ((*(int *)(e + 0x40) == 1) && ((this_00->dndTimer).m_id != Invalid)) {
      QBasicTimer::stop();
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        deselect(this);
        return;
      }
      goto LAB_003eca7c;
    }
    QGuiApplication::clipboard();
    cVar2 = QClipboard::supportsSelection();
    if (cVar2 != '\0') {
      if (*(int *)(e + 0x40) == 1) {
        QWidgetLineControl::copy((QWidgetLineControl *)this_00->control,(EVP_PKEY_CTX *)0x1,src);
      }
      else if ((*(int *)(e + 0x40) == 4) && ((*(ushort *)&this_00->control->field_0x50 & 4) == 0)) {
        deselect(this);
        QWidgetLineControl::paste((QWidgetLineControl *)this_00->control,Selection);
      }
    }
    if ((*(ushort *)(*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600) + 0x50) & 4) == 0) {
      local_30 = QWidget::rect(&this->super_QWidget);
      local_48 = QSinglePointEvent::position((QSinglePointEvent *)e);
      local_38 = QPointF::toPoint(&local_48);
      cVar2 = QRect::contains((QPoint *)&local_30,SUB81(&local_38,0));
      if (cVar2 != '\0') {
        QWidgetPrivate::handleSoftwareInputPanel
                  (&this_00->super_QWidgetPrivate,*(MouseButton *)(e + 0x40),
                   (bool)((this_00->field_0x27c & 0x10) >> 4));
      }
    }
    this_00->field_0x27c = this_00->field_0x27c & 0xef;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_003eca7c:
  __stack_chk_fail();
}

Assistant:

void QLineEdit::mouseReleaseEvent(QMouseEvent* e)
{
    Q_D(QLineEdit);
    if (d->sendMouseEventToInputContext(e))
        return;
#if QT_CONFIG(draganddrop)
    if (e->button() == Qt::LeftButton) {
        if (d->dndTimer.isActive()) {
            d->dndTimer.stop();
            deselect();
            return;
        }
    }
#endif
#ifndef QT_NO_CLIPBOARD
    if (QGuiApplication::clipboard()->supportsSelection()) {
        if (e->button() == Qt::LeftButton) {
            d->control->copy(QClipboard::Selection);
        } else if (!d->control->isReadOnly() && e->button() == Qt::MiddleButton) {
            deselect();
            d->control->paste(QClipboard::Selection);
        }
    }
#endif

    if (!isReadOnly() && rect().contains(e->position().toPoint()))
        d->handleSoftwareInputPanel(e->button(), d->clickCausedFocus);
    d->clickCausedFocus = 0;
}